

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jessilib::
join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,jessilib *this,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string_view<char,_std::char_traits<char>_> *args_3,
          basic_string_view<char,_std::char_traits<char>_> *args_4,
          basic_string_view<char,_std::char_traits<char>_> *args_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
          basic_string_view<char,_std::char_traits<char>_> *args_7)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (size_type)
             (args->_M_str +
              (long)((args_2->_M_dataplus)._M_p +
                    args_4->_M_len + args_3->_M_len + args_1->_M_string_length + *(long *)this) +
              (long)args_5->_M_str + (long)(args_6->_M_dataplus)._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,*(char **)(this + 8),*(size_type *)this);
  impl_join::
  join_append<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,args_1,
             (basic_string_view<char,_std::char_traits<char>_> *)args_2,args_3,args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_5,
             (basic_string_view<char,_std::char_traits<char>_> *)args_6);
  return __return_storage_ptr__;
}

Assistant:

OutT join(ArgsT&&... args) {
	OutT result;
	result.reserve(impl_join::join_sizes(args...));
	impl_join::join_append<OutT, ArgsT...>(result, std::forward<ArgsT>(args)...);
	return result;
}